

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cdata.c
# Opt level: O0

int lj_cdata_get(CTState *cts,CType *s,TValue *o,uint8_t *sp)

{
  uint sid_00;
  CTState *pCVar1;
  TValue *in_RDX;
  CType *in_RSI;
  TValue *in_RDI;
  CTypeID sid;
  CTState *local_80;
  undefined4 in_stack_ffffffffffffff90;
  int iVar2;
  uint in_stack_ffffffffffffff94;
  TValue *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  CTState *in_stack_ffffffffffffffb0;
  
  if (in_RSI->info >> 0x1c == 0xb) {
    cdata_getconst((CTState *)&in_RDI->field_2,in_RDX,in_RSI);
    iVar2 = 0;
  }
  else if (in_RSI->info >> 0x1c == 10) {
    iVar2 = lj_cconv_tv_bf((CTState *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           (CType *)&in_stack_ffffffffffffff98->field_2,
                           (TValue *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           (uint8_t *)&in_RDI->u64);
  }
  else {
    sid_00 = in_RSI->info & 0xffff;
    pCVar1 = (CTState *)(in_RDI->u64 + (ulong)sid_00 * 0x10);
    if (((ulong)pCVar1->tab & 0xf0800000) == 0x20800000) {
      in_stack_ffffffffffffff94 = *(uint *)&pCVar1->tab & 0xffff;
      pCVar1 = (CTState *)(in_RDI->u64 + (ulong)in_stack_ffffffffffffff94 * 0x10);
      in_stack_ffffffffffffff98 = in_RDI;
    }
    while (local_80 = pCVar1, *(uint *)&local_80->tab >> 0x1c == 8) {
      in_stack_ffffffffffffffb0 = local_80;
      pCVar1 = (CTState *)(in_RDI->u64 + (ulong)(*(uint *)&local_80->tab & 0xffff) * 0x10);
    }
    iVar2 = lj_cconv_tv_ct(in_stack_ffffffffffffffb0,(CType *)&in_RDI->field_2,sid_00,
                           in_stack_ffffffffffffff98,
                           (uint8_t *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90))
    ;
  }
  return iVar2;
}

Assistant:

int lj_cdata_get(CTState *cts, CType *s, TValue *o, uint8_t *sp)
{
  CTypeID sid;

  if (ctype_isconstval(s->info)) {
    cdata_getconst(cts, o, s);
    return 0;  /* No GC step needed. */
  } else if (ctype_isbitfield(s->info)) {
    return lj_cconv_tv_bf(cts, s, o, sp);
  }

  /* Get child type of pointer/array/field. */
  lua_assert(ctype_ispointer(s->info) || ctype_isfield(s->info));
  sid = ctype_cid(s->info);
  s = ctype_get(cts, sid);

  /* Resolve reference for field. */
  if (ctype_isref(s->info)) {
    lua_assert(s->size == CTSIZE_PTR);
    sp = *(uint8_t **)sp;
    sid = ctype_cid(s->info);
    s = ctype_get(cts, sid);
  }

  /* Skip attributes. */
  while (ctype_isattrib(s->info))
    s = ctype_child(cts, s);

  return lj_cconv_tv_ct(cts, s, sid, o, sp);
}